

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O0

ctmbstr prvTidyGetEncodingNameFromTidyId(uint id)

{
  uint local_18;
  uint i;
  uint id_local;
  
  local_18 = 0;
  while( true ) {
    if (enc2iana[local_18].name == (ctmbstr)0x0) {
      return (ctmbstr)0x0;
    }
    if (enc2iana[local_18].id == id) break;
    local_18 = local_18 + 1;
  }
  return enc2iana[local_18].name;
}

Assistant:

ctmbstr TY_(GetEncodingNameFromTidyId)(uint id)
{
    uint i;

    for (i = 0; enc2iana[i].name; ++i)
        if (enc2iana[i].id == id)
            return enc2iana[i].name;

    return NULL;
}